

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O2

char * skill_level_name(xchar skill_level)

{
  if ((byte)(skill_level - 1U) < 6) {
    return &DAT_002c3b10 + *(int *)(&DAT_002c3b10 + (ulong)(byte)(skill_level - 1U) * 4);
  }
  return "Unknown";
}

Assistant:

static const char *skill_level_name(xchar skill_level)
{
    const char *ptr;

    switch (skill_level) {
	case P_UNSKILLED:    ptr = "Unskilled"; break;
	case P_BASIC:	     ptr = "Basic";     break;
	case P_SKILLED:	     ptr = "Skilled";   break;
	case P_EXPERT:	     ptr = "Expert";    break;
	/* these are for unarmed combat/martial arts only */
	case P_MASTER:	     ptr = "Master";    break;
	case P_GRAND_MASTER: ptr = "Grand Master"; break;
	default:	     ptr = "Unknown";	break;
    }

    return ptr;
}